

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O2

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileaveBytes_dileaveBytes_random_::run
          (Test_bitileave_ileaveBytes_dileaveBytes_random_ *this)

{
  SourceLocation loc;
  result_type rVar1;
  uint64_t bytes;
  uint64_t bytes_00;
  ushort uVar2;
  long lVar3;
  ulong count;
  string_view msg;
  uint64_t dileaved;
  uint64_t bytesAsInt;
  fast_rng64 rng;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  uniform_int_distribution<unsigned_long> distr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_70;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_50;
  
  rng._M_x = 0x3039;
  distr._M_param._M_a = 0;
  distr._M_param._M_b = 0xffffffffffffffff;
  uVar2 = 0;
  lVar3 = 0x4000;
  while( true ) {
    if (lVar3 == 0) {
      return;
    }
    rVar1 = std::uniform_int_distribution<unsigned_long>::operator()(&distr,&rng);
    bytes_00 = rVar1 >> ((char)((uint)uVar2 % 9) * -8 & 0x3fU);
    if ((ushort)((short)lVar3 + (uVar2 / 9) * 9) == 0x4000) {
      bytes_00 = 0;
    }
    count = (ulong)(ushort)((uint)uVar2 % 9);
    bytesAsInt = bytes_00;
    bytes = detail::ileaveBytes_jmp(bytes_00,count);
    dileaved = detail::dileaveBytes_jmp(bytes,count);
    if (dileaved != bytes_00) break;
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + -1;
  }
  stringify<unsigned_long>(&local_50,&dileaved);
  std::operator+(&local_d0,"Comparison failed: dileaved == bytesAsInt (with \"dileaved\"=",&local_50
                );
  std::operator+(&local_b0,&local_d0,", \"bytesAsInt\"=");
  stringify<unsigned_long>(&local_70,&bytesAsInt);
  std::operator+(&local_90,&local_b0,&local_70);
  std::operator+(&local_100,&local_90,")");
  loc.function = "run";
  loc.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc.line = 0xf8;
  msg._M_str = local_100._M_dataplus._M_p;
  msg._M_len = local_100._M_string_length;
  assertFail(msg,loc);
}

Assistant:

BITMANIP_TEST(bitileave, ileaveBytes_dileaveBytes_random)
{
    constexpr size_t iterations = 1024 * 16;

    fast_rng64 rng{12345};
    std::uniform_int_distribution<std::uint64_t> distr;

    for (size_t i = 0; i < iterations; ++i) {
        std::uint8_t count = i % 9;
        std::uint64_t next = distr(rng);
        std::uint64_t bytesAsInt = count == 0 ? 0 : next >> ((8 - count) * 8);

        std::uint64_t ileaved = ileaveBytes(bytesAsInt, count);
        std::uint64_t dileaved = dileave_bytes(ileaved, count);

        BITMANIP_ASSERT_EQ(dileaved, bytesAsInt);
    }
}